

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fDrawTests.cpp
# Opt level: O3

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_0::InstancedGridRenderTest::iterate
          (InstancedGridRenderTest *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ulong uVar2;
  uint uVar3;
  _Alloc_hider _Var4;
  bool bVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  deUint32 dVar9;
  RenderTarget *pRVar10;
  ShaderProgramDeclaration *pSVar11;
  pointer *__dest;
  ulong *__dest_00;
  char *description;
  int iVar12;
  value_type *__x;
  int iVar13;
  int iVar14;
  size_type __dnew_1;
  deUint32 drawIndirectBuf;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> colors;
  deUint32 colorBuf;
  deUint32 positionBuf;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> offsets;
  size_type __dnew;
  deUint32 vaoID;
  deUint16 indices [6];
  Surface surface;
  DrawElementsCommand command;
  GLContext ctx;
  GridProgram program;
  ulong local_5c0;
  float local_5b4;
  VertexToFragmentVarying local_5b0;
  undefined1 local_5a8 [8];
  pointer pVStack_5a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_598;
  GenericVecType local_588;
  uint local_57c;
  uint local_578;
  uint local_574;
  uint local_570;
  float local_56c;
  ulong *local_568;
  ulong local_560;
  ulong local_558 [2];
  pointer *local_548;
  pointer local_540;
  pointer local_538 [2];
  VertexAttribute local_528;
  FragmentSource local_4f8;
  VertexSource local_4d8;
  undefined4 *local_4b8;
  undefined8 local_4b0;
  undefined4 local_4a8;
  undefined4 uStack_4a4;
  value_type local_498;
  long local_488;
  undefined1 local_480;
  value_type local_478;
  long local_468;
  undefined2 local_460;
  undefined1 local_45e;
  Surface local_450;
  VertexAttribute local_438;
  FragmentOutput local_40c;
  GLContext local_408;
  undefined1 local_298 [20];
  undefined8 local_284;
  undefined8 uStack_27c;
  float local_274;
  pointer local_270;
  undefined4 local_268;
  float local_264;
  pointer local_260;
  float local_258;
  undefined8 local_254;
  undefined4 local_24c;
  float local_248;
  float local_244;
  pointer local_240;
  ShaderProgram local_188;
  
  pRVar10 = Context::getRenderTarget((this->super_TestCase).m_context);
  iVar12 = pRVar10->m_width;
  if (0x3ff < iVar12) {
    iVar12 = 0x400;
  }
  pRVar10 = Context::getRenderTarget((this->super_TestCase).m_context);
  iVar13 = 0x400;
  if (pRVar10->m_height < 0x400) {
    iVar13 = pRVar10->m_height;
  }
  local_188.super_VertexShader._vptr_VertexShader = (_func_int **)0x0;
  local_188.super_VertexShader.m_inputs.
  super__Vector_base<rr::VertexInputInfo,_std::allocator<rr::VertexInputInfo>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = iVar12;
  local_188.super_VertexShader.m_inputs.
  super__Vector_base<rr::VertexInputInfo,_std::allocator<rr::VertexInputInfo>_>._M_impl.
  super__Vector_impl_data._M_start._4_4_ = iVar13;
  sglr::GLContext::GLContext
            (&local_408,((this->super_TestCase).m_context)->m_renderCtx,
             ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,3,
             (IVec4 *)&local_188);
  tcu::Surface::Surface(&local_450,iVar12,iVar13);
  sglr::pdec::ShaderProgramDeclaration::ShaderProgramDeclaration
            ((ShaderProgramDeclaration *)local_298);
  local_478.m_data._0_8_ = &local_468;
  local_468 = 0x697469736f705f61;
  local_460 = 0x6e6f;
  local_478.m_data[2] = 1.4013e-44;
  local_478.m_data[3] = 0.0;
  local_45e = 0;
  local_528.name._M_dataplus._M_p = (pointer)&local_528.name.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_528);
  local_528.type = GENERICVECTYPE_FLOAT;
  pSVar11 = sglr::pdec::ShaderProgramDeclaration::operator<<
                      ((ShaderProgramDeclaration *)local_298,&local_528);
  local_498.m_data._0_8_ = &local_488;
  local_488 = 0x74657366666f5f61;
  local_498.m_data[2] = 1.12104e-44;
  local_498.m_data[3] = 0.0;
  local_480 = 0;
  local_5a8 = (undefined1  [8])&local_598;
  std::__cxx11::string::_M_construct<char*>((string *)local_5a8);
  local_588 = GENERICVECTYPE_FLOAT;
  pSVar11 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar11,(VertexAttribute *)local_5a8);
  local_4b8 = &local_4a8;
  local_4a8 = 0x6f635f61;
  local_4b0 = 7;
  uStack_4a4 = 0x726f6c;
  local_438.name._M_dataplus._M_p = (pointer)&local_438.name.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_438);
  local_438.type = GENERICVECTYPE_FLOAT;
  pSVar11 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar11,&local_438);
  local_5b0.type = GENERICVECTYPE_FLOAT;
  local_5b0.flatshade = false;
  pSVar11 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar11,&local_5b0);
  local_40c.type = GENERICVECTYPE_FLOAT;
  pSVar11 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar11,&local_40c);
  local_4f8.source._M_dataplus._M_p = (pointer)0xbf;
  local_548 = local_538;
  __dest = (pointer *)std::__cxx11::string::_M_create((ulong *)&local_548,(ulong)&local_4f8);
  _Var4._M_p = local_4f8.source._M_dataplus._M_p;
  local_538[0] = local_4f8.source._M_dataplus._M_p;
  local_548 = __dest;
  memcpy(__dest,
         "#version 310 es\nin highp vec4 a_position;\nin highp vec4 a_offset;\nin highp vec4 a_color;\nout highp vec4 v_color;\nvoid main(void)\n{\n\tgl_Position = a_position + a_offset;\n\tv_color = a_color;\n}\n"
         ,0xbf);
  local_540 = _Var4._M_p;
  *((long)__dest + _Var4._M_p) = '\0';
  local_4d8.source._M_dataplus._M_p = (pointer)&local_4d8.source.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_4d8,local_548,_Var4._M_p + (long)local_548);
  pSVar11 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar11,&local_4d8);
  local_5c0 = 0x8a;
  local_568 = local_558;
  __dest_00 = (ulong *)std::__cxx11::string::_M_create((ulong *)&local_568,(ulong)&local_5c0);
  uVar2 = local_5c0;
  local_558[0] = local_5c0;
  local_568 = __dest_00;
  memcpy(__dest_00,
         "#version 310 es\nlayout(location = 0) out highp vec4 dEQP_FragColor;\nin highp vec4 v_color;\nvoid main(void)\n{\n\tdEQP_FragColor = v_color;\n}\n"
         ,0x8a);
  local_560 = uVar2;
  *(undefined1 *)((long)__dest_00 + uVar2) = 0;
  paVar1 = &local_4f8.source.field_2;
  local_4f8.source._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>((string *)&local_4f8,local_568,uVar2 + (long)local_568);
  pSVar11 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar11,&local_4f8);
  sglr::ShaderProgram::ShaderProgram(&local_188,pSVar11);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4f8.source._M_dataplus._M_p != paVar1) {
    operator_delete(local_4f8.source._M_dataplus._M_p,
                    local_4f8.source.field_2._M_allocated_capacity + 1);
  }
  if (local_568 != local_558) {
    operator_delete(local_568,local_558[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4d8.source._M_dataplus._M_p != &local_4d8.source.field_2) {
    operator_delete(local_4d8.source._M_dataplus._M_p,
                    local_4d8.source.field_2._M_allocated_capacity + 1);
  }
  if (local_548 != local_538) {
    operator_delete(local_548,(ulong)(local_538[0] + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_438.name._M_dataplus._M_p != &local_438.name.field_2) {
    operator_delete(local_438.name._M_dataplus._M_p,
                    CONCAT44(local_438.name.field_2._M_allocated_capacity._4_4_,
                             local_438.name.field_2._M_allocated_capacity._0_4_) + 1);
  }
  if (local_4b8 != &local_4a8) {
    operator_delete(local_4b8,CONCAT44(uStack_4a4,local_4a8) + 1);
  }
  if (local_5a8 != (undefined1  [8])&local_598) {
    operator_delete((void *)local_5a8,local_598._M_allocated_capacity + 1);
  }
  if ((long *)local_498.m_data._0_8_ != &local_488) {
    operator_delete((void *)local_498.m_data._0_8_,local_488 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_528.name._M_dataplus._M_p != &local_528.name.field_2) {
    operator_delete(local_528.name._M_dataplus._M_p,local_528.name.field_2._M_allocated_capacity + 1
                   );
  }
  if ((long *)local_478.m_data._0_8_ != &local_468) {
    operator_delete((void *)local_478.m_data._0_8_,local_468 + 1);
  }
  sglr::pdec::ShaderProgramDeclaration::~ShaderProgramDeclaration
            ((ShaderProgramDeclaration *)local_298);
  local_188.super_VertexShader._vptr_VertexShader = (_func_int **)&PTR_shadeVertices_0215dfd8;
  local_188.super_GeometryShader._vptr_GeometryShader = (_func_int **)&DAT_0215e010;
  local_188.super_FragmentShader._vptr_FragmentShader = (_func_int **)&DAT_0215e028;
  local_478.m_data[0] = 0.0;
  local_478.m_data[1] = 1.0;
  local_478.m_data[2] = 0.0;
  local_478.m_data[3] = 1.0;
  local_498.m_data[0] = 1.0;
  local_498.m_data[1] = 1.0;
  local_498.m_data[2] = 0.0;
  local_498.m_data[3] = 1.0;
  local_4d8.source._M_dataplus._M_p = local_4d8.source._M_dataplus._M_p & 0xffffffff00000000;
  local_548 = (pointer *)((ulong)local_548 & 0xffffffff00000000);
  local_4f8.source._M_dataplus._M_p = local_4f8.source._M_dataplus._M_p & 0xffffffff00000000;
  local_568 = (ulong *)((ulong)local_568 & 0xffffffff00000000);
  local_5c0 = local_5c0 & 0xffffffff00000000;
  local_5b0.type = GENERICVECTYPE_FLOAT;
  uVar6 = (*local_408.super_Context._vptr_Context[0x75])();
  uVar7 = (*local_408.super_Context._vptr_Context[0x59])(&local_408,(ulong)uVar6,"a_position");
  uVar8 = (*local_408.super_Context._vptr_Context[0x59])(&local_408,(ulong)uVar6,"a_offset");
  local_574 = (*local_408.super_Context._vptr_Context[0x59])(&local_408,(ulong)uVar6,"a_color");
  iVar12 = this->m_gridSide;
  local_5b4 = 2.0 / (float)iVar12;
  local_298._0_8_ = (pointer)0x0;
  local_298._8_8_ = (pointer)0x3f80000000000000;
  local_284 = 0;
  uStack_27c = 0x3f800000;
  local_270 = (pointer)0x3f80000000000000;
  local_268 = 0;
  local_260 = (pointer)0x3f80000000000000;
  iVar13 = 0;
  local_254 = 0;
  local_24c = 0x3f800000;
  local_240 = (pointer)0x3f80000000000000;
  local_4b8 = (undefined4 *)0x2000300040000;
  local_4b0 = CONCAT44(local_4b0._4_4_,0x50001);
  local_528.name.field_2._M_allocated_capacity = 0;
  local_528.name._M_dataplus._M_p = (pointer)0x0;
  local_528.name._M_string_length = 0;
  local_57c = uVar7;
  local_578 = uVar8;
  local_570 = uVar6;
  local_298._16_4_ = local_5b4;
  local_274 = local_5b4;
  local_264 = local_5b4;
  local_258 = local_5b4;
  local_248 = local_5b4;
  local_244 = local_5b4;
  if (iVar12 < 1) {
    local_5a8 = (undefined1  [8])0x0;
    pVStack_5a0 = (pointer)0x0;
    local_598._M_allocated_capacity = 0;
  }
  else {
    do {
      if (0 < iVar12) {
        local_56c = (float)iVar13 * local_5b4 + -1.0;
        iVar14 = 0;
        do {
          local_5a8._4_4_ = (float)iVar14 * local_5b4 + -1.0;
          local_5a8._0_4_ = local_56c;
          pVStack_5a0 = (pointer)0x0;
          std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>::
          emplace_back<tcu::Vector<float,4>>
                    ((vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>> *)&local_528
                     ,(Vector<float,_4> *)local_5a8);
          iVar14 = iVar14 + 1;
          iVar12 = this->m_gridSide;
        } while (iVar14 < iVar12);
      }
      iVar13 = iVar13 + 1;
    } while (iVar13 < iVar12);
    local_5a8 = (undefined1  [8])0x0;
    pVStack_5a0 = (pointer)0x0;
    local_598._M_allocated_capacity = 0;
    if (0 < iVar12) {
      iVar13 = 0;
      do {
        if (0 < iVar12) {
          iVar14 = 0;
          do {
            __x = &local_498;
            if ((iVar13 + iVar14 & 1U) == 0) {
              __x = &local_478;
            }
            std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::push_back
                      ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                       local_5a8,__x);
            iVar14 = iVar14 + 1;
            iVar12 = this->m_gridSide;
          } while (iVar14 < iVar12);
        }
        iVar13 = iVar13 + 1;
      } while (iVar13 < iVar12);
    }
  }
  (*local_408.super_Context._vptr_Context[0x4c])(&local_408,1,&local_4d8);
  uVar3 = local_570;
  uVar8 = local_574;
  uVar7 = local_578;
  uVar6 = local_57c;
  (*local_408.super_Context._vptr_Context[0x4b])
            (&local_408,(ulong)local_4d8.source._M_dataplus._M_p & 0xffffffff);
  (*local_408.super_Context._vptr_Context[0x26])(&local_408,1,&local_548);
  (*local_408.super_Context._vptr_Context[0x25])(&local_408,0x8892,(ulong)local_548 & 0xffffffff);
  (*local_408.super_Context._vptr_Context[0x28])(&local_408,0x8892,0x60,local_298,0x88e4);
  (*local_408.super_Context._vptr_Context[0x4e])(&local_408,(ulong)uVar6,4,0x1406,0,0,0);
  (*local_408.super_Context._vptr_Context[0x52])(&local_408,(ulong)uVar6,0);
  (*local_408.super_Context._vptr_Context[0x50])(&local_408,(ulong)uVar6);
  (*local_408.super_Context._vptr_Context[0x26])(&local_408,1,&local_4f8);
  (*local_408.super_Context._vptr_Context[0x25])
            (&local_408,0x8892,(ulong)local_4f8.source._M_dataplus._M_p & 0xffffffff);
  (*local_408.super_Context._vptr_Context[0x28])
            (&local_408,0x8892,
             local_528.name._M_string_length - (long)local_528.name._M_dataplus._M_p,
             local_528.name._M_dataplus._M_p,0x88e4);
  (*local_408.super_Context._vptr_Context[0x4e])(&local_408,(ulong)uVar7,4,0x1406,0,0,0);
  (*local_408.super_Context._vptr_Context[0x52])(&local_408,(ulong)uVar7,1);
  (*local_408.super_Context._vptr_Context[0x50])(&local_408,(ulong)uVar7);
  (*local_408.super_Context._vptr_Context[0x26])(&local_408,1,&local_568);
  (*local_408.super_Context._vptr_Context[0x25])(&local_408,0x8892,(ulong)local_568 & 0xffffffff);
  (*local_408.super_Context._vptr_Context[0x28])
            (&local_408,0x8892,(long)pVStack_5a0 - (long)local_5a8,local_5a8,0x88e4);
  (*local_408.super_Context._vptr_Context[0x4e])(&local_408,(ulong)uVar8,4,0x1406,0,0,0);
  (*local_408.super_Context._vptr_Context[0x52])(&local_408,(ulong)uVar8,1);
  (*local_408.super_Context._vptr_Context[0x50])(&local_408,(ulong)uVar8);
  if (this->m_useIndices == true) {
    (*local_408.super_Context._vptr_Context[0x26])(&local_408,1,&local_5c0);
    (*local_408.super_Context._vptr_Context[0x25])(&local_408,0x8893,local_5c0 & 0xffffffff);
    (*local_408.super_Context._vptr_Context[0x28])(&local_408,0x8893,0xc,&local_4b8,0x88e4);
  }
  (*local_408.super_Context._vptr_Context[0x26])(&local_408,1,&local_5b0);
  (*local_408.super_Context._vptr_Context[0x25])(&local_408,0x8f3f,(ulong)local_5b0.type);
  if (this->m_useIndices == true) {
    local_438.name._M_dataplus._M_p._4_4_ = this->m_gridSide * this->m_gridSide;
    local_438.name._M_dataplus._M_p._0_4_ = 6;
    local_438.name._M_string_length = 0;
    local_438.name.field_2._M_allocated_capacity._0_4_ = 0;
    (*local_408.super_Context._vptr_Context[0x28])(&local_408,0x8f3f,0x14,&local_438,0x88e4);
  }
  else {
    local_438.name._M_dataplus._M_p._4_4_ = this->m_gridSide * this->m_gridSide;
    local_438.name._M_dataplus._M_p._0_4_ = 6;
    local_438.name._M_string_length = 0;
    (*local_408.super_Context._vptr_Context[0x28])(&local_408,0x8f3f,0x10,&local_438,0x88e4);
  }
  (*local_408.super_Context._vptr_Context[0x2a])(0,0,0,0x3f800000);
  (*local_408.super_Context._vptr_Context[0x2d])(&local_408,0x4000);
  (*local_408.super_Context._vptr_Context[5])
            (&local_408,0,0,(ulong)(uint)local_450.m_width,(ulong)(uint)local_450.m_height);
  (*local_408.super_Context._vptr_Context[0x76])(&local_408,(ulong)uVar3);
  if (this->m_useIndices == true) {
    (*local_408.super_Context._vptr_Context[0x71])(&local_408,4,0x1403,0);
  }
  else {
    (*local_408.super_Context._vptr_Context[0x70])(&local_408,4,0);
  }
  (*local_408.super_Context._vptr_Context[0x76])(&local_408,0);
  dVar9 = (*local_408.super_Context._vptr_Context[0x79])();
  glu::checkError(dVar9,::glcts::fixed_sample_locations_values + 1,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fDrawTests.cpp"
                  ,0x398);
  (*local_408.super_Context._vptr_Context[0x27])(&local_408,1,&local_5b0);
  if (this->m_useIndices == true) {
    (*local_408.super_Context._vptr_Context[0x27])(&local_408,1,&local_5c0);
  }
  (*local_408.super_Context._vptr_Context[0x27])(&local_408,1,&local_568);
  (*local_408.super_Context._vptr_Context[0x27])(&local_408,1,&local_4f8);
  (*local_408.super_Context._vptr_Context[0x27])(&local_408,1,&local_548);
  (*local_408.super_Context._vptr_Context[0x4d])(&local_408,1,&local_4d8);
  (*local_408.super_Context._vptr_Context[0x77])(&local_408,(ulong)uVar3);
  (*local_408.super_Context._vptr_Context[0x7a])();
  (*local_408.super_Context._vptr_Context[0x80])
            (&local_408,&local_450,0,0,(ulong)(uint)local_450.m_width,
             (ulong)(uint)local_450.m_height);
  dVar9 = (*local_408.super_Context._vptr_Context[0x79])();
  glu::checkError(dVar9,::glcts::fixed_sample_locations_values + 1,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fDrawTests.cpp"
                  ,0x3a6);
  if (local_5a8 != (undefined1  [8])0x0) {
    operator_delete((void *)local_5a8,local_598._M_allocated_capacity - (long)local_5a8);
  }
  if (local_528.name._M_dataplus._M_p != (pointer)0x0) {
    operator_delete(local_528.name._M_dataplus._M_p,
                    local_528.name.field_2._M_allocated_capacity -
                    (long)local_528.name._M_dataplus._M_p);
  }
  bVar5 = verifyImageYellowGreen
                    (&local_450,
                     ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log);
  description = "Result image invalid";
  if (bVar5) {
    description = "Pass";
  }
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,(uint)!bVar5,description
            );
  sglr::ShaderProgram::~ShaderProgram(&local_188);
  tcu::Surface::~Surface(&local_450);
  sglr::GLContext::~GLContext(&local_408);
  return STOP;
}

Assistant:

InstancedGridRenderTest::IterateResult InstancedGridRenderTest::iterate (void)
{
	const int renderTargetWidth  = de::min(1024, m_context.getRenderTarget().getWidth());
	const int renderTargetHeight = de::min(1024, m_context.getRenderTarget().getHeight());

	sglr::GLContext ctx		(m_context.getRenderContext(), m_testCtx.getLog(), sglr::GLCONTEXT_LOG_CALLS | sglr::GLCONTEXT_LOG_PROGRAMS, tcu::IVec4(0, 0, renderTargetWidth, renderTargetHeight));
	tcu::Surface	surface	(renderTargetWidth, renderTargetHeight);
	GridProgram		program;

	// render

	renderTo(ctx, program, surface);

	// verify image
	// \note the green/yellow pattern is only for clarity. The test will only verify that all instances were drawn by looking for anything non-green/yellow.
	if (verifyImageYellowGreen(surface, m_testCtx.getLog()))
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	else
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Result image invalid");
	return STOP;
}